

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::LossLayer::MergePartialFromCodedStream
          (LossLayer *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  CategoricalCrossEntropyLossLayer *this_01;
  MeanSquaredErrorLossLayer *this_02;
  pair<int,_int> pVar8;
  char cVar9;
  ulong uVar10;
  string *value;
  
  this_00 = &this->name_;
LAB_00236d0f:
  pbVar2 = input->buffer_;
  uVar5 = 0;
  if (pbVar2 < input->buffer_end_) {
    bVar1 = *pbVar2;
    uVar5 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_00236d32;
    input->buffer_ = pbVar2 + 1;
    uVar10 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_00236d32:
    uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
    uVar10 = 0;
    if (uVar5 - 1 < 0x7f) {
      uVar10 = 0x100000000;
    }
    uVar10 = uVar5 | uVar10;
  }
  uVar5 = (uint32)uVar10;
  if ((uVar10 & 0x100000000) != 0) {
    uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar10;
    if (uVar6 == 0xb) {
      if (cVar9 != 'Z') goto LAB_00236d53;
      if (this->_oneof_case_[0] == 0xb) {
        this_02 = (this->LossLayerType_).meansquarederrorlosslayer_;
      }
      else {
        clear_LossLayerType(this);
        this->_oneof_case_[0] = 0xb;
        this_02 = (MeanSquaredErrorLossLayer *)operator_new(0x28);
        MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer(this_02);
        (this->LossLayerType_).meansquarederrorlosslayer_ = this_02;
      }
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar4 = MeanSquaredErrorLossLayer::MergePartialFromCodedStream(this_02,input);
LAB_00236eef:
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar8.first);
      goto LAB_00236d74;
    }
    if (uVar6 != 10) {
      if ((uVar6 != 1) || (cVar9 != '\n')) goto LAB_00236d53;
      value = this_00->ptr_;
      if (value == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)
                           &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        value = this_00->ptr_;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
      if (!bVar4) {
        return false;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,
                         PARSE,"CoreML.Specification.LossLayer.name");
      if (!bVar4) {
        return false;
      }
      goto LAB_00236d0f;
    }
    if (cVar9 == 'R') {
      if (this->_oneof_case_[0] == 10) {
        this_01 = (this->LossLayerType_).categoricalcrossentropylosslayer_;
      }
      else {
        clear_LossLayerType(this);
        this->_oneof_case_[0] = 10;
        this_01 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
        CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer(this_01);
        (this->LossLayerType_).categoricalcrossentropylosslayer_ = this_01;
      }
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < (char)*puVar3)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar4 = CategoricalCrossEntropyLossLayer::MergePartialFromCodedStream(this_01,input);
      goto LAB_00236eef;
    }
  }
LAB_00236d53:
  if (uVar5 == 0) {
    return true;
  }
  if ((uVar5 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_00236d74:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_00236d0f;
}

Assistant:

bool LossLayer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LossLayer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.LossLayer.name"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CategoricalCrossEntropyLossLayer categoricalCrossEntropyLossLayer = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_categoricalcrossentropylosslayer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.MeanSquaredErrorLossLayer meanSquaredErrorLossLayer = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_meansquarederrorlosslayer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LossLayer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LossLayer)
  return false;
#undef DO_
}